

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MoiraDasmMMU_cpp.h
# Opt level: O1

void __thiscall
moira::Moira::dasmPLoad<(moira::Instr)183,(moira::Mode)10,4>
          (Moira *this,StrWriter *str,u32 *addr,u16 op)

{
  u32 uVar1;
  int iVar2;
  Syntax SVar3;
  char *pcVar4;
  uint uVar5;
  long lVar6;
  char *pcVar7;
  char cVar8;
  Ea<(moira::Mode)10,_4> ea;
  Ea<(moira::Mode)10,_4> local_44;
  
  uVar1 = *addr;
  *addr = uVar1 + 2;
  uVar5 = (*this->_vptr_Moira[6])();
  Op<(moira::Mode)10,4>(&local_44,this,op & 7,addr);
  if ((str->style->syntax & ~MOIRA_MIT) == GNU) {
    *addr = uVar1;
    dasmIllegal<(moira::Instr)183,(moira::Mode)10,4>(this,str,addr,op);
  }
  else {
    cVar8 = 'p';
    lVar6 = 1;
    do {
      pcVar7 = str->ptr;
      str->ptr = pcVar7 + 1;
      *pcVar7 = cVar8;
      cVar8 = "pload"[lVar6];
      lVar6 = lVar6 + 1;
    } while (lVar6 != 6);
    pcVar7 = "r";
    if (((uVar5 & 0xffff) >> 9 & 1) == 0) {
      pcVar7 = "w";
    }
    cVar8 = *pcVar7;
    while (cVar8 != '\0') {
      pcVar7 = pcVar7 + 1;
      pcVar4 = str->ptr;
      str->ptr = pcVar4 + 1;
      *pcVar4 = cVar8;
      cVar8 = *pcVar7;
    }
    if ((str->style->syntax & ~MOIRA_MIT) == GNU) {
      pcVar7 = str->ptr;
      str->ptr = pcVar7 + 1;
      *pcVar7 = ' ';
    }
    else {
      iVar2 = (str->tab).raw;
      do {
        pcVar7 = str->ptr;
        str->ptr = pcVar7 + 1;
        *pcVar7 = ' ';
      } while (str->ptr < str->base + iVar2);
    }
    StrWriter::operator<<(str,(Fc)(uVar5 & 0x1f));
    pcVar7 = str->ptr;
    str->ptr = pcVar7 + 1;
    *pcVar7 = ',';
    SVar3 = str->style->syntax;
    if ((SVar3 < (MUSASHI|MOIRA_MIT)) && ((0x13U >> (SVar3 & 0x1f) & 1) != 0)) {
      pcVar7 = str->ptr;
      str->ptr = pcVar7 + 1;
      *pcVar7 = ' ';
    }
    StrWriter::operator<<(str,&local_44);
  }
  return;
}

Assistant:

void
Moira::dasmPLoad(StrWriter &str, u32 &addr, u16 op) const
{
    auto old = addr;
    auto ext = dasmIncRead<Word>(addr);
    auto ea  = Op <M,S> ( _____________xxx(op), addr );

    // Catch illegal extension words
    if (str.style.syntax == Syntax::GNU || str.style.syntax == Syntax::GNU_MIT) {

        if (!isValidExtMMU(I, M, op, ext)) {

            addr = old;
            dasmIllegal<I, M, S>(str, addr, op);
            return;
        }
    }

    str << Ins<I>{} << ((ext & 0x200) ? "r" : "w") << str.tab;
    str << Fc(ext & 0b11111) << Sep{} << ea;
}